

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

void __thiscall Query::Query(Query *this,QString *qstr)

{
  pointer pQVar1;
  
  this->type = PRIMITIVE;
  pQVar1 = (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_start = (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
             super__Vector_impl_data._M_start;
  (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_finish = pQVar1;
  (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->ngram).itype = GRAM3;
  (this->ngram).trigram = 0;
  this->count = 0;
  (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Query::Query(QString &&qstr)
    : type(QueryType::PRIMITIVE), count(0), value(std::move(qstr)) {}